

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void buildshifts(lemon *lemp,state *stp)

{
  int iVar1;
  symbol *b;
  rule *rp;
  int iVar2;
  config *pcVar3;
  config *pcVar4;
  plink *ppVar5;
  state *arg;
  config *pcVar6;
  long lVar7;
  
  for (pcVar3 = stp->cfp; pcVar3 != (config *)0x0; pcVar3 = pcVar3->next) {
    pcVar3->status = INCOMPLETE;
  }
  pcVar3 = stp->cfp;
  if (pcVar3 != (config *)0x0) {
    do {
      if ((pcVar3->status != COMPLETE) && (pcVar3->dot < pcVar3->rp->nrhs)) {
        Configlist_reset();
        b = pcVar3->rp->rhs[pcVar3->dot];
        pcVar6 = pcVar3;
        do {
          if (pcVar6->status != COMPLETE) {
            iVar1 = pcVar6->dot;
            rp = pcVar6->rp;
            if ((iVar1 < rp->nrhs) && (iVar2 = same_symbol(rp->rhs[iVar1],b), iVar2 != 0)) {
              pcVar6->status = COMPLETE;
              pcVar4 = Configlist_addbasis(rp,iVar1 + 1);
              ppVar5 = Plink_new();
              ppVar5->next = pcVar4->bplp;
              pcVar4->bplp = ppVar5;
              ppVar5->cfp = pcVar6;
            }
          }
          pcVar6 = pcVar6->next;
        } while (pcVar6 != (config *)0x0);
        arg = getstate(lemp);
        if (b->type == MULTITERMINAL) {
          if (0 < b->nsubsym) {
            lVar7 = 0;
            do {
              Action_add(&stp->ap,SHIFT,b->subsym[lVar7],(char *)arg);
              lVar7 = lVar7 + 1;
            } while (lVar7 < b->nsubsym);
          }
        }
        else {
          Action_add(&stp->ap,SHIFT,b,(char *)arg);
        }
      }
      pcVar3 = pcVar3->next;
    } while (pcVar3 != (config *)0x0);
  }
  return;
}

Assistant:

PRIVATE void buildshifts(struct lemon *lemp, struct state *stp)
{
  struct config *cfp;  /* For looping thru the config closure of "stp" */
  struct config *bcfp; /* For the inner loop on config closure of "stp" */
  struct config *newcfg;  /* */
  struct symbol *sp;   /* Symbol following the dot in configuration "cfp" */
  struct symbol *bsp;  /* Symbol following the dot in configuration "bcfp" */
  struct state *newstp; /* A pointer to a successor state */

  /* Each configuration becomes complete after it contibutes to a successor
  ** state.  Initially, all configurations are incomplete */
  for(cfp=stp->cfp; cfp; cfp=cfp->next) cfp->status = INCOMPLETE;

  /* Loop through all configurations of the state "stp" */
  for(cfp=stp->cfp; cfp; cfp=cfp->next){
    if( cfp->status==COMPLETE ) continue;    /* Already used by inner loop */
    if( cfp->dot>=cfp->rp->nrhs ) continue;  /* Can't shift this config */
    Configlist_reset();                      /* Reset the new config set */
    sp = cfp->rp->rhs[cfp->dot];             /* Symbol after the dot */

    /* For every configuration in the state "stp" which has the symbol "sp"
    ** following its dot, add the same configuration to the basis set under
    ** construction but with the dot shifted one symbol to the right. */
    for(bcfp=cfp; bcfp; bcfp=bcfp->next){
      if( bcfp->status==COMPLETE ) continue;    /* Already used */
      if( bcfp->dot>=bcfp->rp->nrhs ) continue; /* Can't shift this one */
      bsp = bcfp->rp->rhs[bcfp->dot];           /* Get symbol after dot */
      if( !same_symbol(bsp,sp) ) continue;      /* Must be same as for "cfp" */
      bcfp->status = COMPLETE;                  /* Mark this config as used */
      newcfg = Configlist_addbasis(bcfp->rp,bcfp->dot+1);
      Plink_add(&newcfg->bplp,bcfp);
    }

    /* Get a pointer to the state described by the basis configuration set
    ** constructed in the preceding loop */
    newstp = getstate(lemp);

    /* The state "newstp" is reached from the state "stp" by a shift action
    ** on the symbol "sp" */
    if( sp->type==MULTITERMINAL ){
      int i;
      for(i=0; i<sp->nsubsym; i++){
        Action_add(&stp->ap,SHIFT,sp->subsym[i],(char*)newstp);
      }
    }else{
      Action_add(&stp->ap,SHIFT,sp,(char *)newstp);
    }
  }
}